

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict
right_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t left,
        nonterm_func_t right)

{
  token_t ptVar1;
  pos_t p;
  node_t_conflict pnVar2;
  node_t_conflict op;
  node *pnVar3;
  node_code_t local_4c;
  char *local_48;
  undefined8 local_40;
  
  pnVar2 = (*left)(c2m_ctx,no_err_p);
  pnVar3 = &err_struct;
  if (pnVar2 != &err_struct) {
    ptVar1 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar1 == token) {
      local_48 = (ptVar1->pos).fname;
      local_40._0_4_ = (ptVar1->pos).lno;
      local_40._4_4_ = (ptVar1->pos).ln_pos;
      local_4c = ptVar1->node_code;
      read_token(c2m_ctx);
    }
    else {
      if (token2 < 0) {
        return pnVar2;
      }
      ptVar1 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar1 != token2) {
        return pnVar2;
      }
      local_48 = (ptVar1->pos).fname;
      local_40._0_4_ = (ptVar1->pos).lno;
      local_40._4_4_ = (ptVar1->pos).ln_pos;
      local_4c = ptVar1->node_code;
      read_token(c2m_ctx);
    }
    p.lno = (undefined4)local_40;
    p.ln_pos = local_40._4_4_;
    p.fname = local_48;
    pnVar2 = new_pos_node1(c2m_ctx,local_4c,p,pnVar2);
    op = (*right)(c2m_ctx,no_err_p);
    pnVar3 = &err_struct;
    if (op != &err_struct) {
      op_append(c2m_ctx,pnVar2,op);
      pnVar3 = pnVar2;
    }
  }
  return pnVar3;
}

Assistant:

static node_t right_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t left,
                        nonterm_func_t right) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (left);
  if (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (right);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}